

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_prepare_horizontal_filter_coeff(int alpha,int sx,__m128i *coeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 *in_RDX;
  int in_ESI;
  int in_EDI;
  __m128i tmp_14;
  __m128i tmp_12;
  __m128i tmp_10;
  __m128i tmp_8;
  __m128i tmp_6;
  __m128i tmp_4;
  __m128i tmp_2;
  __m128i tmp_0;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_98;
  undefined4 uStack_94;
  __m128i tmp_15;
  __m128i tmp_13;
  __m128i tmp_11;
  __m128i tmp_9;
  __m128i tmp_7;
  __m128i tmp_5;
  __m128i tmp_3;
  __m128i tmp_1;
  
  iVar1 = in_ESI + in_EDI * 2 >> 10;
  iVar2 = in_ESI + in_EDI * 4 >> 10;
  iVar3 = in_ESI + in_EDI * 6 >> 10;
  local_98 = (undefined4)*(undefined8 *)av1_warped_filter[in_ESI >> 10];
  uStack_94 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[in_ESI >> 10] >> 0x20);
  local_a8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar1];
  uStack_a4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar1] >> 0x20);
  local_b8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar2];
  uStack_b4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar2] >> 0x20);
  local_c8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar3];
  uStack_c4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar3] >> 0x20);
  tmp_1[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4);
  tmp_1[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[in_ESI >> 10] + 4) >> 0x20)
  ;
  tmp_3[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar1] + 4);
  tmp_3[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar1] + 4) >> 0x20);
  tmp_5[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar2] + 4);
  tmp_5[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar2] + 4) >> 0x20);
  tmp_7[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar3] + 4);
  tmp_7[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar3] + 4) >> 0x20);
  *in_RDX = local_98;
  in_RDX[1] = local_a8;
  in_RDX[2] = local_b8;
  in_RDX[3] = local_c8;
  in_RDX[8] = uStack_94;
  in_RDX[9] = uStack_a4;
  in_RDX[10] = uStack_b4;
  in_RDX[0xb] = uStack_c4;
  in_RDX[0x10] = (undefined4)tmp_1[0];
  in_RDX[0x11] = (undefined4)tmp_3[0];
  in_RDX[0x12] = (undefined4)tmp_5[0];
  in_RDX[0x13] = (undefined4)tmp_7[0];
  in_RDX[0x18] = tmp_1[0]._4_4_;
  in_RDX[0x19] = tmp_3[0]._4_4_;
  in_RDX[0x1a] = tmp_5[0]._4_4_;
  in_RDX[0x1b] = tmp_7[0]._4_4_;
  iVar1 = in_ESI + in_EDI >> 10;
  iVar2 = in_ESI + in_EDI * 3 >> 10;
  iVar3 = in_ESI + in_EDI * 5 >> 10;
  iVar4 = in_ESI + in_EDI * 7 >> 10;
  local_d8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar1];
  uStack_d4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar1] >> 0x20);
  local_e8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar2];
  uStack_e4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar2] >> 0x20);
  local_f8 = (undefined4)*(undefined8 *)av1_warped_filter[iVar3];
  uStack_f4 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar3] >> 0x20);
  local_108 = (undefined4)*(undefined8 *)av1_warped_filter[iVar4];
  uStack_104 = (undefined4)((ulong)*(undefined8 *)av1_warped_filter[iVar4] >> 0x20);
  tmp_9[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar1] + 4);
  tmp_9[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar1] + 4) >> 0x20);
  tmp_11[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar2] + 4);
  tmp_11[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar2] + 4) >> 0x20);
  tmp_13[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar3] + 4);
  tmp_13[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar3] + 4) >> 0x20);
  tmp_15[0]._0_4_ = (undefined4)*(undefined8 *)(av1_warped_filter[iVar4] + 4);
  tmp_15[0]._4_4_ = (undefined4)((ulong)*(undefined8 *)(av1_warped_filter[iVar4] + 4) >> 0x20);
  in_RDX[4] = local_d8;
  in_RDX[5] = local_e8;
  in_RDX[6] = local_f8;
  in_RDX[7] = local_108;
  in_RDX[0xc] = uStack_d4;
  in_RDX[0xd] = uStack_e4;
  in_RDX[0xe] = uStack_f4;
  in_RDX[0xf] = uStack_104;
  in_RDX[0x14] = (undefined4)tmp_9[0];
  in_RDX[0x15] = (undefined4)tmp_11[0];
  in_RDX[0x16] = (undefined4)tmp_13[0];
  in_RDX[0x17] = (undefined4)tmp_15[0];
  in_RDX[0x1c] = tmp_9[0]._4_4_;
  in_RDX[0x1d] = tmp_11[0]._4_4_;
  in_RDX[0x1e] = tmp_13[0]._4_4_;
  in_RDX[0x1f] = tmp_15[0]._4_4_;
  return;
}

Assistant:

static inline void highbd_prepare_horizontal_filter_coeff(int alpha, int sx,
                                                          __m128i *coeff) {
  // Filter even-index pixels
  const __m128i tmp_0 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 0 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_2 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 2 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_4 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 4 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_6 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 6 * alpha) >> WARPEDDIFF_PREC_BITS)));

  // coeffs 0 1 0 1 2 3 2 3 for pixels 0, 2
  const __m128i tmp_8 = _mm_unpacklo_epi32(tmp_0, tmp_2);
  // coeffs 0 1 0 1 2 3 2 3 for pixels 4, 6
  const __m128i tmp_10 = _mm_unpacklo_epi32(tmp_4, tmp_6);
  // coeffs 4 5 4 5 6 7 6 7 for pixels 0, 2
  const __m128i tmp_12 = _mm_unpackhi_epi32(tmp_0, tmp_2);
  // coeffs 4 5 4 5 6 7 6 7 for pixels 4, 6
  const __m128i tmp_14 = _mm_unpackhi_epi32(tmp_4, tmp_6);

  // coeffs 0 1 0 1 0 1 0 1 for pixels 0, 2, 4, 6
  coeff[0] = _mm_unpacklo_epi64(tmp_8, tmp_10);
  // coeffs 2 3 2 3 2 3 2 3 for pixels 0, 2, 4, 6
  coeff[2] = _mm_unpackhi_epi64(tmp_8, tmp_10);
  // coeffs 4 5 4 5 4 5 4 5 for pixels 0, 2, 4, 6
  coeff[4] = _mm_unpacklo_epi64(tmp_12, tmp_14);
  // coeffs 6 7 6 7 6 7 6 7 for pixels 0, 2, 4, 6
  coeff[6] = _mm_unpackhi_epi64(tmp_12, tmp_14);

  // Filter odd-index pixels
  const __m128i tmp_1 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 1 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_3 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 3 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_5 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 5 * alpha) >> WARPEDDIFF_PREC_BITS)));
  const __m128i tmp_7 =
      _mm_loadu_si128((__m128i *)(av1_warped_filter +
                                  ((sx + 7 * alpha) >> WARPEDDIFF_PREC_BITS)));

  const __m128i tmp_9 = _mm_unpacklo_epi32(tmp_1, tmp_3);
  const __m128i tmp_11 = _mm_unpacklo_epi32(tmp_5, tmp_7);
  const __m128i tmp_13 = _mm_unpackhi_epi32(tmp_1, tmp_3);
  const __m128i tmp_15 = _mm_unpackhi_epi32(tmp_5, tmp_7);

  coeff[1] = _mm_unpacklo_epi64(tmp_9, tmp_11);
  coeff[3] = _mm_unpackhi_epi64(tmp_9, tmp_11);
  coeff[5] = _mm_unpacklo_epi64(tmp_13, tmp_15);
  coeff[7] = _mm_unpackhi_epi64(tmp_13, tmp_15);
}